

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::
Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastInstancesIterator>_>_>
::Stack(Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastInstancesIterator>_>_>
        *this,size_t initialCapacity)

{
  void *pvVar1;
  long in_RSI;
  long *in_RDI;
  void *mem;
  
  *in_RDI = in_RSI;
  if (*in_RDI == 0) {
    in_RDI[1] = 0;
  }
  else {
    pvVar1 = Lib::alloc((size_t)in_RDI);
    in_RDI[1] = (long)pvVar1;
  }
  in_RDI[2] = in_RDI[1];
  in_RDI[3] = in_RDI[1] + *in_RDI * 8;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }